

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidationContextImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::ValidationContextImpl::ValidationContextImpl
          (ValidationContextImpl *this,MemoryManager *manager)

{
  MemoryManager *pMVar1;
  XMLSize_t XVar2;
  int iVar3;
  RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *pRVar4;
  undefined4 extraout_var;
  XMLSize_t XVar5;
  
  (this->super_ValidationContext).fMemoryManager = manager;
  (this->super_ValidationContext)._vptr_ValidationContext =
       (_func_int **)&PTR__ValidationContextImpl_00415558;
  this->fIdRefList = (RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *)0x0;
  this->fEntityDeclPool = (NameIdPool<xercesc_4_0::DTDEntityDecl> *)0x0;
  this->fToCheckIdRefList = true;
  this->fValidatingMemberType = (DatatypeValidator *)0x0;
  this->fElemStack = (ElemStack *)0x0;
  this->fScanner = (XMLScanner *)0x0;
  this->fNamespaceScope = (NamespaceScope *)0x0;
  pRVar4 = (RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new(0x38,manager);
  pMVar1 = (this->super_ValidationContext).fMemoryManager;
  pRVar4->fMemoryManager = pMVar1;
  pRVar4->fAdoptedElems = true;
  pRVar4->fBucketList = (RefHashTableBucketElem<xercesc_4_0::XMLRefInfo> **)0x0;
  pRVar4->fHashModulus = 0x6d;
  pRVar4->fInitialModulus = 0x6d;
  pRVar4->fCount = 0;
  iVar3 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,0x368);
  pRVar4->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::XMLRefInfo> **)CONCAT44(extraout_var,iVar3);
  XVar2 = pRVar4->fHashModulus;
  if (XVar2 != 0) {
    XVar5 = 0;
    do {
      pRVar4->fBucketList[XVar5] = (RefHashTableBucketElem<xercesc_4_0::XMLRefInfo> *)0x0;
      XVar5 = XVar5 + 1;
    } while (XVar2 != XVar5);
  }
  this->fIdRefList = pRVar4;
  return;
}

Assistant:

ValidationContextImpl::ValidationContextImpl(MemoryManager* const manager)
:ValidationContext(manager)
,fIdRefList(0)
,fEntityDeclPool(0)
,fToCheckIdRefList(true)
,fValidatingMemberType(0)
,fElemStack(0)
,fScanner(0)
,fNamespaceScope(0)
{
    fIdRefList = new (fMemoryManager) RefHashTableOf<XMLRefInfo>(109, fMemoryManager);
}